

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMan.c
# Opt level: O0

void Cov_ManFree(Cov_Man_t *p)

{
  Vec_Int_t *p_00;
  int local_1c;
  int i;
  Vec_Int_t *vSupp;
  Cov_Man_t *p_local;
  
  for (local_1c = 0; local_1c < p->vObjStrs->nSize; local_1c = local_1c + 1) {
    p_00 = *(Vec_Int_t **)((long)p->vObjStrs->pArray[local_1c] + 0x18);
    if (p_00 != (Vec_Int_t *)0x0) {
      Vec_IntFree(p_00);
    }
  }
  Min_ManFree(p->pManMin);
  Vec_PtrFree(p->vObjStrs);
  Vec_IntFree(p->vFanCounts);
  Vec_IntFree(p->vTriv0);
  Vec_IntFree(p->vTriv1);
  Vec_IntFree(p->vComTo0);
  Vec_IntFree(p->vComTo1);
  Vec_IntFree(p->vPairs0);
  Vec_IntFree(p->vPairs1);
  if (p->pMemory != (void *)0x0) {
    free(p->pMemory);
    p->pMemory = (void *)0x0;
  }
  if (p != (Cov_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Cov_ManFree( Cov_Man_t * p )
{
    Vec_Int_t * vSupp;
    int i;
    for ( i = 0; i < p->vObjStrs->nSize; i++ )
    {
        vSupp = ((Cov_Obj_t *)p->vObjStrs->pArray[i])->vSupp;
        if ( vSupp ) Vec_IntFree( vSupp );
    }

    Min_ManFree( p->pManMin );
    Vec_PtrFree( p->vObjStrs );
    Vec_IntFree( p->vFanCounts );
    Vec_IntFree( p->vTriv0 );
    Vec_IntFree( p->vTriv1 );
    Vec_IntFree( p->vComTo0 );
    Vec_IntFree( p->vComTo1 );
    Vec_IntFree( p->vPairs0 );
    Vec_IntFree( p->vPairs1 );
    ABC_FREE( p->pMemory );
    ABC_FREE( p );
}